

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr ielem)

{
  xmlChar **ppxVar1;
  xmlSchemaIDCMatcherPtr pxVar2;
  void *pvVar3;
  xmlSchemaPSVIIDCBindingPtr pxVar4;
  int iVar5;
  xmlSchemaPSVIIDCBindingPtr_conflict bind;
  long lVar6;
  xmlSchemaItemListPtr pxVar7;
  xmlSchemaIDCMatcherPtr_conflict pxVar8;
  
  ielem->hasKeyrefs = 0;
  ielem->appliedXPath = 0;
  ppxVar1 = &ielem->localName;
  if ((ielem->flags & 1) == 0) {
    *ppxVar1 = (xmlChar *)0x0;
    ielem->nsName = (xmlChar *)0x0;
  }
  else {
    if (*ppxVar1 != (xmlChar *)0x0) {
      (*xmlFree)(*ppxVar1);
      *ppxVar1 = (xmlChar *)0x0;
    }
    if (ielem->nsName != (xmlChar *)0x0) {
      (*xmlFree)(ielem->nsName);
      ielem->nsName = (xmlChar *)0x0;
    }
  }
  if ((ielem->flags & 2) != 0) {
    if (ielem->value == (xmlChar *)0x0) goto LAB_0018fa5e;
    (*xmlFree)(ielem->value);
  }
  ielem->value = (xmlChar *)0x0;
LAB_0018fa5e:
  if (ielem->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(ielem->val);
    ielem->val = (xmlSchemaValPtr)0x0;
  }
  pxVar8 = ielem->idcMatchers;
  if (pxVar8 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    do {
      pxVar2 = pxVar8->next;
      if ((pxVar8->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) &&
         (iVar5 = pxVar8->sizeKeySeqs, 0 < iVar5)) {
        lVar6 = 0;
        do {
          if (pxVar8->keySeqs[lVar6] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
            (*xmlFree)(pxVar8->keySeqs[lVar6]);
            pxVar8->keySeqs[lVar6] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
            iVar5 = pxVar8->sizeKeySeqs;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
      }
      pxVar7 = pxVar8->targets;
      if (pxVar7 != (xmlSchemaItemListPtr)0x0) {
        if ((pxVar8->idcType == 0x18) && (0 < pxVar7->nbItems)) {
          lVar6 = 0;
          do {
            pvVar3 = pxVar7->items[lVar6];
            (*xmlFree)(*(void **)((long)pvVar3 + 8));
            (*xmlFree)(pvVar3);
            lVar6 = lVar6 + 1;
            pxVar7 = pxVar8->targets;
          } while (lVar6 < pxVar7->nbItems);
        }
        if (pxVar7->items != (void **)0x0) {
          (*xmlFree)(pxVar7->items);
        }
        (*xmlFree)(pxVar7);
        pxVar8->targets = (xmlSchemaItemListPtr)0x0;
      }
      if (pxVar8->htab != (xmlHashTablePtr)0x0) {
        xmlHashFree(pxVar8->htab,xmlFreeIDCHashEntry);
        pxVar8->htab = (xmlHashTablePtr)0x0;
      }
      pxVar8->next = (xmlSchemaIDCMatcherPtr)0x0;
      if (vctxt->idcMatcherCache != (xmlSchemaIDCMatcherPtr)0x0) {
        pxVar8->nextCached = vctxt->idcMatcherCache;
      }
      vctxt->idcMatcherCache = pxVar8;
      pxVar8 = pxVar2;
    } while (pxVar2 != (xmlSchemaIDCMatcherPtr)0x0);
    ielem->idcMatchers = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  bind = ielem->idcTable;
  if (ielem->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    do {
      pxVar4 = bind->next;
      xmlSchemaIDCFreeBinding(bind);
      bind = pxVar4;
    } while (pxVar4 != (xmlSchemaPSVIIDCBindingPtr)0x0);
    ielem->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
  }
  if (ielem->regexCtxt != (xmlRegExecCtxtPtr)0x0) {
    xmlRegFreeExecCtxt(ielem->regexCtxt);
    ielem->regexCtxt = (xmlRegExecCtxtPtr)0x0;
  }
  if (ielem->nsBindings != (xmlChar **)0x0) {
    (*xmlFree)(ielem->nsBindings);
    ielem->nsBindings = (xmlChar **)0x0;
    ielem->nbNsBindings = 0;
    ielem->sizeNsBindings = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,
		       xmlSchemaNodeInfoPtr ielem)
{
    ielem->hasKeyrefs = 0;
    ielem->appliedXPath = 0;
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	FREE_AND_NULL(ielem->localName);
	FREE_AND_NULL(ielem->nsName);
    } else {
	ielem->localName = NULL;
	ielem->nsName = NULL;
    }
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	FREE_AND_NULL(ielem->value);
    } else {
	ielem->value = NULL;
    }
    if (ielem->val != NULL) {
	/*
	* PSVI TODO: Be careful not to free it when the value is
	* exposed via PSVI.
	*/
	xmlSchemaFreeValue(ielem->val);
	ielem->val = NULL;
    }
    if (ielem->idcMatchers != NULL) {
	/*
	* REVISIT OPTIMIZE TODO: Use a pool of IDC matchers.
	*   Does it work?
	*/
	xmlSchemaIDCReleaseMatcherList(vctxt, ielem->idcMatchers);
#if 0
	xmlSchemaIDCFreeMatcherList(ielem->idcMatchers);
#endif
	ielem->idcMatchers = NULL;
    }
    if (ielem->idcTable != NULL) {
	/*
	* OPTIMIZE TODO: Use a pool of IDC tables??.
	*/
	xmlSchemaIDCFreeIDCTable(ielem->idcTable);
	ielem->idcTable = NULL;
    }
    if (ielem->regexCtxt != NULL) {
	xmlRegFreeExecCtxt(ielem->regexCtxt);
	ielem->regexCtxt = NULL;
    }
    if (ielem->nsBindings != NULL) {
	xmlFree((xmlChar **)ielem->nsBindings);
	ielem->nsBindings = NULL;
	ielem->nbNsBindings = 0;
	ielem->sizeNsBindings = 0;
    }
}